

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impulse.hpp
# Opt level: O0

value_type __thiscall
vista::circular::example::impulse<double,_2UL>::value(impulse<double,_2UL> *this)

{
  const_iterator __first2;
  double dVar1;
  const_iterator __first1;
  const_iterator __last1;
  impulse<double,_2UL> *this_local;
  
  __first1 = circular_view<double,_2UL>::begin(&(this->window).super_circular_view<double,_2UL>);
  __last1 = circular_view<double,_2UL>::end(&(this->window).super_circular_view<double,_2UL>);
  __first2 = std::array<double,_2UL>::begin(&this->coefficients);
  dVar1 = std::
          inner_product<vista::circular_view<double,2ul>::basic_iterator<double_const>,double_const*,double>
                    (__first1,__last1,__first2,0.0);
  return dVar1;
}

Assistant:

value_type value() const
    {
        return std::inner_product(window.begin(),
                                  window.end(),
                                  coefficients.begin(),
                                  value_type{});
    }